

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filereader.cpp
# Opt level: O0

void __thiscall
indigox::utils::FileReader::GetAllItems
          (FileReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_items)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  ostream *poVar4;
  istream *piVar5;
  char *pcVar6;
  string *in_RDI;
  istringstream itemiser;
  ifstream infile;
  String line;
  String next_item;
  undefined7 in_stack_fffffffffffffbd8;
  istringstream local_3e8 [400];
  long local_258 [65];
  string local_50 [32];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::ifstream::ifstream(local_258);
  std::ifstream::open(local_258,in_RDI,8);
  bVar1 = std::ios::operator!((ios *)((long)local_258 + *(long *)(local_258[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_258,local_50);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::istringstream::istringstream(local_3e8,local_50,8);
      while( true ) {
        piVar5 = std::operator>>((istream *)local_3e8,local_30);
        uVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if ((!(bool)uVar3) ||
           (pcVar6 = (char *)std::__cxx11::string::at((ulong)local_30), *pcVar6 == '#')) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)piVar5,(value_type *)CONCAT17(uVar3,in_stack_fffffffffffffbd8));
      }
      std::__cxx11::istringstream::~istringstream(local_3e8);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_258);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_30);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to open file: ");
  poVar4 = std::operator<<(poVar4,in_RDI);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void FileReader::GetAllItems(std::vector<String> &out_items)
    {
      String next_item, line;
      std::ifstream infile;
      infile.open(path_);
      
      /// @todo Throw an exception when can't open file.
      if (!infile) {
        std::cerr << "Unable to open file: " << path_ << std::endl;
        std::exit(1);
      }
      
      while (std::getline(infile, line)) {
        std::istringstream itemiser(line);
        while (itemiser >> next_item) {
          if (next_item.at(0) == '#') break;
          out_items.push_back(next_item);
        }
      }
      
      infile.close();
    }